

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzma2_decoder.c
# Opt level: O0

lzma_ret lzma_lzma2_props_decode
                   (void **options,lzma_allocator *allocator,uint8_t *props,size_t props_size)

{
  uint *puVar1;
  lzma_options_lzma *opt;
  size_t props_size_local;
  uint8_t *props_local;
  lzma_allocator *allocator_local;
  void **options_local;
  
  if (props_size == 1) {
    if ((*props & 0xc0) == 0) {
      if (*props < 0x29) {
        puVar1 = (uint *)lzma_alloc(0x70,allocator);
        if (puVar1 == (uint *)0x0) {
          options_local._4_4_ = LZMA_MEM_ERROR;
        }
        else {
          if (*props == '(') {
            *puVar1 = 0xffffffff;
          }
          else {
            *puVar1 = *props & 1 | 2;
            *puVar1 = *puVar1 << ((*props >> 1) + 0xb & 0x1f);
          }
          puVar1[2] = 0;
          puVar1[3] = 0;
          puVar1[4] = 0;
          *options = puVar1;
          options_local._4_4_ = LZMA_OK;
        }
      }
      else {
        options_local._4_4_ = LZMA_OPTIONS_ERROR;
      }
    }
    else {
      options_local._4_4_ = LZMA_OPTIONS_ERROR;
    }
  }
  else {
    options_local._4_4_ = LZMA_OPTIONS_ERROR;
  }
  return options_local._4_4_;
}

Assistant:

extern lzma_ret
lzma_lzma2_props_decode(void **options, const lzma_allocator *allocator,
		const uint8_t *props, size_t props_size)
{
	if (props_size != 1)
		return LZMA_OPTIONS_ERROR;

	// Check that reserved bits are unset.
	if (props[0] & 0xC0)
		return LZMA_OPTIONS_ERROR;

	// Decode the dictionary size.
	if (props[0] > 40)
		return LZMA_OPTIONS_ERROR;

	lzma_options_lzma *opt = lzma_alloc(
			sizeof(lzma_options_lzma), allocator);
	if (opt == NULL)
		return LZMA_MEM_ERROR;

	if (props[0] == 40) {
		opt->dict_size = UINT32_MAX;
	} else {
		opt->dict_size = 2 | (props[0] & 1U);
		opt->dict_size <<= props[0] / 2U + 11;
	}

	opt->preset_dict = NULL;
	opt->preset_dict_size = 0;

	*options = opt;

	return LZMA_OK;
}